

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O0

void deqp::gls::StateQueryUtil::verifyIntegerVec3
               (ResultCollector *result,QueriedState *state,IVec3 *expected)

{
  int iVar1;
  DataType DVar2;
  GLIntVec3 *paGVar3;
  int *piVar4;
  ostream *poVar5;
  ArrayPointer<int> AVar6;
  string local_1e8;
  int *local_1c8;
  int local_1c0;
  ArrayPointer<int> local_1b8 [2];
  ostringstream local_198 [8];
  ostringstream buf;
  IVec3 *expected_local;
  QueriedState *state_local;
  ResultCollector *result_local;
  
  buf._368_8_ = expected;
  DVar2 = QueriedState::getType(state);
  if (DVar2 == DATATYPE_INTEGER_VEC3) {
    paGVar3 = QueriedState::getIntVec3Access(state);
    iVar1 = (*paGVar3)[0];
    piVar4 = tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)buf._368_8_,0);
    if (iVar1 == *piVar4) {
      paGVar3 = QueriedState::getIntVec3Access(state);
      iVar1 = (*paGVar3)[1];
      piVar4 = tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)buf._368_8_,1);
      if (iVar1 == *piVar4) {
        paGVar3 = QueriedState::getIntVec3Access(state);
        iVar1 = (*paGVar3)[2];
        piVar4 = tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)buf._368_8_,2);
        if (iVar1 == *piVar4) {
          return;
        }
      }
    }
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar5 = std::operator<<((ostream *)local_198,"Expected ");
    poVar5 = tcu::operator<<(poVar5,(Vector<int,_3> *)buf._368_8_);
    poVar5 = std::operator<<(poVar5,", got ");
    paGVar3 = QueriedState::getIntVec3Access(state);
    AVar6 = tcu::formatArray<int,3>((int (*) [3])paGVar3);
    local_1c8 = AVar6.arr;
    local_1c0 = AVar6.size;
    local_1b8[0].arr = local_1c8;
    local_1b8[0].size = local_1c0;
    tcu::Format::operator<<(poVar5,local_1b8);
    std::__cxx11::ostringstream::str();
    tcu::ResultCollector::fail(result,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return;
}

Assistant:

void verifyIntegerVec3 (tcu::ResultCollector& result, QueriedState& state, const tcu::IVec3& expected)
{
	switch (state.getType())
	{
		case DATATYPE_INTEGER_VEC3:
		{
			if (state.getIntVec3Access()[0] != expected[0] ||
				state.getIntVec3Access()[1] != expected[1] ||
				state.getIntVec3Access()[2] != expected[2])
			{
				std::ostringstream buf;
				buf << "Expected " << expected << ", got " << tcu::formatArray(state.getIntVec3Access());
				result.fail(buf.str());
			}
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
			break;
	}
}